

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O0

void Saig_MvManStop(Saig_MvMan_t *p)

{
  Saig_MvMan_t *p_local;
  
  Aig_MmFixedStop(p->pMemStates,0);
  Vec_PtrFree(p->vStates);
  Vec_IntFreeP(&p->vXFlops);
  Vec_PtrFree(p->vFlops);
  Vec_PtrFree(p->vTired);
  if (*p->pRegsValues != (int *)0x0) {
    free(*p->pRegsValues);
    *p->pRegsValues = (int *)0x0;
  }
  if (p->pRegsValues != (int **)0x0) {
    free(p->pRegsValues);
    p->pRegsValues = (int **)0x0;
  }
  if (p->nRegsValues != (int *)0x0) {
    free(p->nRegsValues);
    p->nRegsValues = (int *)0x0;
  }
  if (p->pRegsUndef != (int *)0x0) {
    free(p->pRegsUndef);
    p->pRegsUndef = (int *)0x0;
  }
  if (p->pAigOld != (Saig_MvObj_t *)0x0) {
    free(p->pAigOld);
    p->pAigOld = (Saig_MvObj_t *)0x0;
  }
  if (p->pTStates != (uint *)0x0) {
    free(p->pTStates);
    p->pTStates = (uint *)0x0;
  }
  if (p->pAigNew != (Saig_MvAnd_t *)0x0) {
    free(p->pAigNew);
    p->pAigNew = (Saig_MvAnd_t *)0x0;
  }
  if (p->pTNodes != (int *)0x0) {
    free(p->pTNodes);
    p->pTNodes = (int *)0x0;
  }
  if (p->pLevels != (uchar *)0x0) {
    free(p->pLevels);
    p->pLevels = (uchar *)0x0;
  }
  if (p != (Saig_MvMan_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Saig_MvManStop( Saig_MvMan_t * p )
{
    Aig_MmFixedStop( p->pMemStates, 0 );
    Vec_PtrFree( p->vStates );
    Vec_IntFreeP( &p->vXFlops );
    Vec_PtrFree( p->vFlops );
    Vec_PtrFree( p->vTired );
    ABC_FREE( p->pRegsValues[0] );
    ABC_FREE( p->pRegsValues );
    ABC_FREE( p->nRegsValues );
    ABC_FREE( p->pRegsUndef );
    ABC_FREE( p->pAigOld );
    ABC_FREE( p->pTStates );
    ABC_FREE( p->pAigNew );
    ABC_FREE( p->pTNodes );
    ABC_FREE( p->pLevels );
    ABC_FREE( p );
}